

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storage.hpp
# Opt level: O0

Time __thiscall Storage::Time::operator-=(Time *this,Time *other)

{
  uint64_t local_30;
  uint64_t result_clock_rate;
  uint64_t result_length;
  Time *other_local;
  Time *this_local;
  
  if (other->length == 0) {
    this_local = *(Time **)this;
  }
  else {
    if (this->clock_rate == other->clock_rate) {
      result_clock_rate = (ulong)this->length - (ulong)other->length;
      local_30 = (uint64_t)this->clock_rate;
    }
    else {
      result_clock_rate =
           (ulong)this->length * (ulong)other->clock_rate -
           (ulong)other->length * (ulong)this->clock_rate;
      local_30 = (ulong)this->clock_rate * (ulong)other->clock_rate;
    }
    install_result(this,result_clock_rate,local_30);
    this_local = *(Time **)this;
  }
  return (Time)this_local;
}

Assistant:

inline Time operator -= (const Time &other) {
		if(!other.length) return *this;

		uint64_t result_length;
		uint64_t result_clock_rate;
		if(clock_rate == other.clock_rate) {
			result_length = uint64_t(length) - uint64_t(other.length);
			result_clock_rate = uint64_t(clock_rate);
		} else {
			result_length = uint64_t(length) * uint64_t(other.clock_rate) - uint64_t(other.length) * uint64_t(clock_rate);
			result_clock_rate = uint64_t(clock_rate) * uint64_t(other.clock_rate);
		}
		install_result(result_length, result_clock_rate);
		return *this;
	}